

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rfc5444_reader_blockcb.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  char **argv_local;
  int argc_local;
  
  rfc5444_reader_init(&reader);
  rfc5444_reader_add_packet_consumer(&reader,&consumer,consumer_entries,2,in_R8,in_R9,argv,argc);
  consumer.block_callback = cb_blocktlv_packet_okay;
  consumer.block_callback_failed_constraints = cb_blocktlv_packet_failed;
  BEGIN_TESTING(clear_elements);
  test_packet1();
  test_packet12();
  test_packet121();
  test_packet212();
  rfc5444_reader_cleanup(&reader);
  iVar1 = FINISH_TESTING();
  return iVar1;
}

Assistant:

int main(int argc __attribute__ ((unused)), char **argv __attribute__ ((unused))) {
  rfc5444_reader_init(&reader);
  rfc5444_reader_add_packet_consumer(&reader, &consumer, consumer_entries, ARRAYSIZE(consumer_entries));
  consumer.block_callback = cb_blocktlv_packet_okay;
  consumer.block_callback_failed_constraints = cb_blocktlv_packet_failed;

  BEGIN_TESTING(clear_elements);

  test_packet1();
  test_packet12();
  test_packet121();
  test_packet212();

  rfc5444_reader_cleanup(&reader);

  return FINISH_TESTING();
}